

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_column_reader.cpp
# Opt level: O2

idx_t __thiscall
duckdb::ExpressionColumnReader::Read
          (ExpressionColumnReader *this,uint64_t num_values,data_ptr_t define_out,
          data_ptr_t repeat_out,Vector *result)

{
  int iVar1;
  reference pvVar2;
  pointer pCVar3;
  undefined4 extraout_var;
  
  duckdb::DataChunk::Reset();
  pvVar2 = vector<duckdb::Vector,_true>::get<true>
                     ((vector<duckdb::Vector,_true> *)&this->intermediate_chunk,0);
  pCVar3 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
           operator->(&this->child_reader);
  iVar1 = (*pCVar3->_vptr_ColumnReader[3])
                    (pCVar3,num_values,define_out,repeat_out,pvVar2,pCVar3->_vptr_ColumnReader,
                     result);
  *(idx_t *)&this->field_0x218 = CONCAT44(extraout_var,iVar1);
  duckdb::ExpressionExecutor::ExecuteExpression
            ((DataChunk *)&this->executor,(Vector *)&this->intermediate_chunk);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

idx_t ExpressionColumnReader::Read(uint64_t num_values, data_ptr_t define_out, data_ptr_t repeat_out, Vector &result) {
	intermediate_chunk.Reset();
	auto &intermediate_vector = intermediate_chunk.data[0];

	auto amount = child_reader->Read(num_values, define_out, repeat_out, intermediate_vector);
	// Execute the expression
	intermediate_chunk.SetCardinality(amount);
	executor.ExecuteExpression(intermediate_chunk, result);
	return amount;
}